

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_boundary_constraint
          (LatticeImpl *this,size_t pos,int boundary_constraint_type)

{
  int iVar1;
  ulong in_RAX;
  undefined4 extraout_var;
  pointer puVar2;
  undefined8 uStack_28;
  
  puVar2 = (this->boundary_constraint_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 == (this->boundary_constraint_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    uStack_28 = in_RAX;
    iVar1 = (*(this->super_Lattice)._vptr_Lattice[0xb])();
    uStack_28 = uStack_28 & 0xffffffffffffff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->boundary_constraint_,CONCAT44(extraout_var,iVar1) + 4,
               (value_type_conflict5 *)((long)&uStack_28 + 7));
    puVar2 = (this->boundary_constraint_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  puVar2[pos] = (uchar)boundary_constraint_type;
  return;
}

Assistant:

void LatticeImpl::set_boundary_constraint(size_t pos,
                                          int boundary_constraint_type) {
  if (boundary_constraint_.empty()) {
    boundary_constraint_.resize(size() + 4, MECAB_ANY_BOUNDARY);
  }
  boundary_constraint_[pos] = boundary_constraint_type;
}